

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O0

void __thiscall SuiteTimeRangeTests::TestisInRange::RunImpl(TestisInRange *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_378;
  UtcTimeStamp local_358 [2];
  TestDetails local_320;
  UtcTimeStamp local_300 [2];
  TestDetails local_2c8;
  UtcTimeStamp local_2a8 [2];
  TestDetails local_270;
  UtcTimeStamp local_250;
  UtcTimeOnly local_238;
  UtcTimeOnly local_220 [2];
  TestDetails local_1e8;
  UtcTimeStamp local_1c8 [2];
  TestDetails local_190;
  UtcTimeStamp local_170 [2];
  TestDetails local_138;
  UtcTimeStamp local_118 [2];
  TestDetails local_e0;
  UtcTimeStamp local_c0 [2];
  TestDetails local_88;
  undefined1 local_68 [8];
  UtcTimeStamp now;
  undefined1 local_40 [8];
  UtcTimeOnly end;
  UtcTimeOnly start;
  TestisInRange *this_local;
  
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&end.super_DateTime.m_time,3,0,0,0);
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)local_40,0x12,0,0,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_68,10,0,0,10,10,2000);
  bVar2 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_68);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_88,*ppTVar4,0x2a);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_88,"TimeRange::isInRange( start, end, now )")
    ;
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_c0,0x12,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_68,local_c0);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_c0);
  bVar2 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_68);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_e0,*ppTVar4,0x2d);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_e0,"TimeRange::isInRange( start, end, now )")
    ;
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_118,2,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_68,local_118);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_118);
  bVar2 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_68);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_138,*ppTVar4,0x30);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_138,"!TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_170,0x13,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_68,local_170);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_170);
  bVar2 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_68);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_190,*ppTVar4,0x33);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_190,"!TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_1c8,0x12,0,1,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_68,local_1c8);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_1c8);
  bVar2 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_68);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1e8,*ppTVar4,0x36);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_1e8,"!TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_220,0x12,0,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&end.super_DateTime.m_time,local_220);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_220);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_238,3,0,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_238);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_238);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_250,0x12,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_68,&local_250);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_250);
  bVar2 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_68);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_270,*ppTVar4,0x3b);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_270,"TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_2a8,3,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_68,local_2a8);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_2a8);
  bVar2 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_68);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_2c8,*ppTVar4,0x3e);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_2c8,"TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_300,4,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_68,local_300);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_300);
  bVar2 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_68);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_320,*ppTVar4,0x41);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_320,"!TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_358,0x11,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_68,local_358);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_358);
  bVar2 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_68);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_378,*ppTVar4,0x44);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_378,"!TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_68);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)local_40);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&end.super_DateTime.m_time);
  return;
}

Assistant:

TEST(isInRange)
{
  UtcTimeOnly start( 3, 0, 0 );
  UtcTimeOnly end( 18, 0, 0 );

  UtcTimeStamp now( 10, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 18, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 2, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 18, 0, 1, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  start = UtcTimeOnly( 18, 0, 0 );
  end = UtcTimeOnly( 3, 0, 0 );
  now = UtcTimeStamp( 18, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 3, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 4, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 17, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );
}